

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O0

int __thiscall zmq::zmtp_engine_t::process_heartbeat_message(zmtp_engine_t *this,msg_t *msg_)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  int *piVar6;
  undefined4 *puVar7;
  void *pvVar8;
  msg_t *in_RSI;
  io_object_t *in_RDI;
  char *errstr;
  int rc;
  size_t context_len;
  uint16_t remote_heartbeat_ttl;
  size_t ping_max_ctx_len;
  size_t ping_ttl_len;
  undefined8 in_stack_ffffffffffffffa8;
  msg_t *in_stack_ffffffffffffffb8;
  unsigned_long local_38;
  unsigned_long local_30;
  uint16_t local_22;
  stream_engine_base_t *this_00;
  
  bVar1 = msg_t::is_ping(in_RSI);
  if (bVar1) {
    this_00 = (stream_engine_base_t *)0x10;
    pvVar3 = msg_t::data(in_stack_ffffffffffffffb8);
    local_22 = *(uint16_t *)((long)pvVar3 + 5);
    local_22 = ntohs(local_22);
    local_22 = local_22 * 100;
    if ((((ulong)in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events & 0x100) == 0) &&
       (local_22 != 0)) {
      io_object_t::add_timer
                (in_RDI,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                 (int)in_stack_ffffffffffffffa8);
      *(undefined1 *)((long)&in_RDI[0x5c].super_i_poll_events._vptr_i_poll_events + 1) = 1;
    }
    sVar4 = msg_t::size(in_stack_ffffffffffffffb8);
    local_38 = sVar4 - 7;
    puVar5 = std::min<unsigned_long>(&local_38,(unsigned_long *)&stack0xffffffffffffffe0);
    local_30 = *puVar5;
    iVar2 = msg_t::init_size(in_stack_ffffffffffffffb8,(size_t)in_RDI);
    if (iVar2 != 0) {
      piVar6 = __errno_location();
      in_stack_ffffffffffffffb8 = (msg_t *)strerror(*piVar6);
      fprintf(_stderr,"%s (%s:%d)\n",in_stack_ffffffffffffffb8,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x21c);
      fflush(_stderr);
      zmq_abort((char *)0x244ed3);
    }
    msg_t::set_flags((msg_t *)(in_RDI + 0x6a),'\x02');
    puVar7 = (undefined4 *)msg_t::data(in_stack_ffffffffffffffb8);
    *puVar7 = 0x4e4f5004;
    *(undefined1 *)(puVar7 + 1) = 0x47;
    if (local_30 != 0) {
      pvVar3 = msg_t::data(in_stack_ffffffffffffffb8);
      pvVar3 = (void *)((long)pvVar3 + 5);
      pvVar8 = msg_t::data(in_stack_ffffffffffffffb8);
      memcpy(pvVar3,(void *)((long)pvVar8 + 7),local_30);
    }
    in_RDI[0x55].super_i_poll_events._vptr_i_poll_events = (_func_int **)0x0;
    in_RDI[0x54]._poller = (poller_t *)0x99;
    stream_engine_base_t::out_event(this_00);
  }
  return 0;
}

Assistant:

int zmq::zmtp_engine_t::process_heartbeat_message (msg_t *msg_)
{
    if (msg_->is_ping ()) {
        // 16-bit TTL + \4PING == 7
        const size_t ping_ttl_len = msg_t::ping_cmd_name_size + 2;
        const size_t ping_max_ctx_len = 16;
        uint16_t remote_heartbeat_ttl;

        // Get the remote heartbeat TTL to setup the timer
        memcpy (&remote_heartbeat_ttl,
                static_cast<uint8_t *> (msg_->data ())
                  + msg_t::ping_cmd_name_size,
                ping_ttl_len - msg_t::ping_cmd_name_size);
        remote_heartbeat_ttl = ntohs (remote_heartbeat_ttl);
        // The remote heartbeat is in 10ths of a second
        // so we multiply it by 100 to get the timer interval in ms.
        remote_heartbeat_ttl *= 100;

        if (!_has_ttl_timer && remote_heartbeat_ttl > 0) {
            add_timer (remote_heartbeat_ttl, heartbeat_ttl_timer_id);
            _has_ttl_timer = true;
        }

        //  As per ZMTP 3.1 the PING command might contain an up to 16 bytes
        //  context which needs to be PONGed back, so build the pong message
        //  here and store it. Truncate it if it's too long.
        //  Given the engine goes straight to out_event, sequential PINGs will
        //  not be a problem.
        const size_t context_len =
          std::min (msg_->size () - ping_ttl_len, ping_max_ctx_len);
        const int rc =
          _pong_msg.init_size (msg_t::ping_cmd_name_size + context_len);
        errno_assert (rc == 0);
        _pong_msg.set_flags (msg_t::command);
        memcpy (_pong_msg.data (), "\4PONG", msg_t::ping_cmd_name_size);
        if (context_len > 0)
            memcpy (static_cast<uint8_t *> (_pong_msg.data ())
                      + msg_t::ping_cmd_name_size,
                    static_cast<uint8_t *> (msg_->data ()) + ping_ttl_len,
                    context_len);

        _next_msg = static_cast<int (stream_engine_base_t::*) (msg_t *)> (
          &zmtp_engine_t::produce_pong_message);
        out_event ();
    }

    return 0;
}